

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O0

Ptr<Sampler>
myvk::Sampler::Create
          (Ptr<Device> *device,VkFilter filter,VkSamplerAddressMode address_mode,
          VkSamplerMipmapMode mipmap_mode,float max_lod,bool request_anisotropy,float max_anisotropy
          )

{
  element_type *this;
  PhysicalDeviceFeatures *pPVar1;
  element_type *in_RDI;
  undefined1 in_R9B;
  undefined4 in_XMM1_Da;
  Ptr<Sampler> PVar2;
  VkSamplerCreateInfo create_info;
  undefined4 local_78 [11];
  undefined4 local_4c;
  uint local_48;
  undefined4 local_44;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 in_stack_ffffffffffffffd4;
  undefined3 in_stack_ffffffffffffffdc;
  uint uVar3;
  
  uVar3 = CONCAT13(in_R9B,in_stack_ffffffffffffffdc) & 0x1ffffff;
  memset(local_78,0,0x50);
  local_78[0] = 0x1f;
  local_4c = 0;
  local_3c = 0;
  local_38 = 0;
  this = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    0x2e707b);
  pPVar1 = Device::GetEnabledFeatures(this);
  if ((pPVar1->vk10).samplerAnisotropy == 0) {
    local_48 = 0;
    local_44 = 0x3f800000;
  }
  else {
    local_48 = (uint)((uVar3 & 0x1000000) != 0);
    local_44 = in_XMM1_Da;
  }
  PVar2 = Create((Ptr<Device> *)CONCAT44(uVar3,in_XMM1_Da),
                 (VkSamplerCreateInfo *)CONCAT44(in_stack_ffffffffffffffd4,3));
  PVar2.super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<Sampler>)PVar2.super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Sampler> Sampler::Create(const Ptr<Device> &device, VkFilter filter, VkSamplerAddressMode address_mode,
                             VkSamplerMipmapMode mipmap_mode, float max_lod, bool request_anisotropy,
                             float max_anisotropy) {
	VkSamplerCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
	create_info.magFilter = filter;
	create_info.minFilter = filter;
	create_info.mipmapMode = mipmap_mode;
	create_info.addressModeU = address_mode;
	create_info.addressModeV = address_mode;
	create_info.addressModeW = address_mode;
	create_info.mipLodBias = 0.0f;
	create_info.compareOp = VK_COMPARE_OP_NEVER;
	create_info.minLod = 0.0f;
	create_info.maxLod = max_lod;
	if (device->GetEnabledFeatures().vk10.samplerAnisotropy) {
		create_info.anisotropyEnable = request_anisotropy ? VK_TRUE : VK_FALSE;
		create_info.maxAnisotropy = max_anisotropy;
	} else {
		create_info.anisotropyEnable = VK_FALSE;
		create_info.maxAnisotropy = 1.0;
	}
	create_info.borderColor = VK_BORDER_COLOR_INT_OPAQUE_BLACK;

	return Create(device, create_info);
}